

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  container_t *c;
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  int i;
  long lVar7;
  
  stat->sum_value = 0;
  stat->cardinality = 0;
  stat->n_bytes_run_containers = 0;
  stat->n_bytes_bitset_containers = 0;
  stat->max_value = 0;
  stat->min_value = 0;
  stat->n_values_array_containers = 0;
  stat->n_values_run_containers = 0;
  stat->n_values_bitset_containers = 0;
  stat->n_bytes_array_containers = 0;
  stat->n_containers = 0;
  stat->n_array_containers = 0;
  stat->n_run_containers = 0;
  stat->n_bitset_containers = 0;
  stat->n_containers = (r->high_low_container).size;
  uVar1 = roaring_bitmap_minimum(r);
  stat->min_value = uVar1;
  uVar1 = roaring_bitmap_maximum(r);
  stat->max_value = uVar1;
  for (lVar7 = 0; lVar7 < (r->high_low_container).size; lVar7 = lVar7 + 1) {
    c = (r->high_low_container).containers[lVar7];
    uVar5 = (r->high_low_container).typecodes[lVar7];
    uVar6 = uVar5;
    if (uVar5 == '\x04') {
      uVar6 = *(uint8_t *)((long)c + 8);
    }
    uVar2 = container_get_cardinality(c,uVar5);
    piVar4 = (int *)(r->high_low_container).containers[lVar7];
    uVar5 = (r->high_low_container).typecodes[lVar7];
    if (uVar5 == '\x04') {
      uVar5 = (uint8_t)piVar4[2];
      piVar4 = *(int **)piVar4;
    }
    if (uVar5 == '\x01') {
      iVar3 = 0x2000;
    }
    else if (uVar5 == '\x03') {
      iVar3 = *piVar4 * 4 + 2;
    }
    else {
      iVar3 = *piVar4 * 2;
    }
    stat->cardinality = stat->cardinality + (ulong)uVar2;
    if (uVar6 == '\x03') {
      stat->n_run_containers = stat->n_run_containers + 1;
      stat->n_values_run_containers = stat->n_values_run_containers + uVar2;
      stat->n_bytes_run_containers = stat->n_bytes_run_containers + iVar3;
    }
    else if (uVar6 == '\x02') {
      stat->n_array_containers = stat->n_array_containers + 1;
      stat->n_values_array_containers = stat->n_values_array_containers + uVar2;
      stat->n_bytes_array_containers = stat->n_bytes_array_containers + iVar3;
    }
    else {
      stat->n_bitset_containers = stat->n_bitset_containers + 1;
      stat->n_values_bitset_containers = stat->n_values_bitset_containers + uVar2;
      stat->n_bytes_bitset_containers = stat->n_bytes_bitset_containers + iVar3;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->min_value = roaring_bitmap_minimum(r);
    stat->max_value = roaring_bitmap_maximum(r);

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        stat->cardinality += card;
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                roaring_unreachable;
        }
    }
}